

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  bool bVar1;
  size_t sVar2;
  ImGuiTextRange *pIVar3;
  bool local_3a;
  bool local_39;
  ImGuiTextRange *f;
  undefined1 local_20 [4];
  int i;
  ImGuiTextRange input_range;
  ImGuiTextFilter *this_local;
  
  input_range.e = this->InputBuf;
  ImVector<ImGuiTextFilter::ImGuiTextRange>::resize(&this->Filters,0);
  sVar2 = strlen(this->InputBuf);
  ImGuiTextRange::ImGuiTextRange((ImGuiTextRange *)local_20,this->InputBuf,this->InputBuf + sVar2);
  ImGuiTextRange::split((ImGuiTextRange *)local_20,',',&this->Filters);
  this->CountGrep = 0;
  for (f._4_4_ = 0; f._4_4_ != (this->Filters).Size; f._4_4_ = f._4_4_ + 1) {
    pIVar3 = ImVector<ImGuiTextFilter::ImGuiTextRange>::operator[](&this->Filters,f._4_4_);
    while( true ) {
      local_39 = false;
      if (pIVar3->b < pIVar3->e) {
        local_39 = ImCharIsBlankA(*pIVar3->b);
      }
      if (local_39 == false) break;
      pIVar3->b = pIVar3->b + 1;
    }
    while( true ) {
      local_3a = false;
      if (pIVar3->b < pIVar3->e) {
        local_3a = ImCharIsBlankA(pIVar3->e[-1]);
      }
      if (local_3a == false) break;
      pIVar3->e = pIVar3->e + -1;
    }
    bVar1 = ImGuiTextRange::empty(pIVar3);
    if ((!bVar1) &&
       (pIVar3 = ImVector<ImGuiTextFilter::ImGuiTextRange>::operator[](&this->Filters,f._4_4_),
       *pIVar3->b != '-')) {
      this->CountGrep = this->CountGrep + 1;
    }
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    ImGuiTextRange input_range(InputBuf, InputBuf + strlen(InputBuf));
    input_range.split(',', &Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        ImGuiTextRange& f = Filters[i];
        while (f.b < f.e && ImCharIsBlankA(f.b[0]))
            f.b++;
        while (f.e > f.b && ImCharIsBlankA(f.e[-1]))
            f.e--;
        if (f.empty())
            continue;
        if (Filters[i].b[0] != '-')
            CountGrep += 1;
    }
}